

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::Harness::Test(Harness *this,Random *rnd)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  STLLessThan SVar5;
  undefined4 extraout_var_00;
  long lVar6;
  _Rb_tree_node_base *p_Var7;
  undefined4 extraout_var_01;
  KVMap *kvmap;
  string key;
  KVMap data;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  Random *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  undefined1 local_1f0 [32];
  string last;
  Iterator *pIVar4;
  
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210 = rnd;
  data._M_t._M_impl.super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>.
  _M_key_compare.cmp = (STLLessThan)BytewiseComparator();
  data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data._M_t._M_impl.super__Rb_tree_header._M_header;
  data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  kvmap = &data;
  data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Constructor::Finish(this->constructor_,&this->options_,&keys,kvmap);
  iVar2 = (*this->constructor_->_vptr_Constructor[3])();
  pIVar4 = (Iterator *)CONCAT44(extraout_var,iVar2);
  test::Tester::Tester
            ((Tester *)&last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x1c9);
  iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
  test::Tester::Is((Tester *)&last,(bool)((byte)iVar2 ^ 1),"!iter->Valid()");
  test::Tester::~Tester((Tester *)&last);
  (*pIVar4->_vptr_Iterator[3])(pIVar4);
  for (SVar5.cmp = (Comparator *)data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1f0._0_8_ = SVar5.cmp,
      (_Rb_tree_header *)SVar5.cmp != &data._M_t._M_impl.super__Rb_tree_header;
      SVar5.cmp = (Comparator *)std::_Rb_tree_increment((_Rb_tree_node_base *)SVar5.cmp)) {
    test::Tester::Tester
              ((Tester *)&last,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
               ,0x1cd);
    ToString(&key,(Harness *)&data,(KVMap *)local_1f0,(const_iterator *)kvmap);
    ToString_abi_cxx11_(&local_250,this,pIVar4);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>((Tester *)&last,&key,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&key);
    test::Tester::~Tester((Tester *)&last);
    (*pIVar4->_vptr_Iterator[6])(pIVar4);
  }
  test::Tester::Tester
            ((Tester *)&last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x1d0);
  iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
  test::Tester::Is((Tester *)&last,(bool)((byte)iVar2 ^ 1),"!iter->Valid()");
  test::Tester::~Tester((Tester *)&last);
  (*pIVar4->_vptr_Iterator[1])(pIVar4);
  iVar2 = (*this->constructor_->_vptr_Constructor[3])();
  pIVar4 = (Iterator *)CONCAT44(extraout_var_00,iVar2);
  test::Tester::Tester
            ((Tester *)&last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x1d7);
  iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
  test::Tester::Is((Tester *)&last,(bool)((byte)iVar2 ^ 1),"!iter->Valid()");
  test::Tester::~Tester((Tester *)&last);
  (*pIVar4->_vptr_Iterator[4])(pIVar4);
  for (p_Var7 = &data._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var7 != data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var7)) {
    test::Tester::Tester
              ((Tester *)&last,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
               ,0x1db);
    if (p_Var7 == data._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__cxx11::string::string((string *)&local_230,"END",(allocator *)&key);
    }
    else {
      lVar6 = std::_Rb_tree_decrement(p_Var7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "\'",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (lVar6 + 0x20));
      std::operator+(&local_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "->");
      lVar6 = std::_Rb_tree_decrement(p_Var7);
      std::operator+(&key,&local_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar6 + 0x40));
      std::operator+(&local_230,&key,"\'");
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)local_1f0);
    }
    ToString_abi_cxx11_(&key,this,pIVar4);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>((Tester *)&last,&local_230,&key);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&local_230);
    test::Tester::~Tester((Tester *)&last);
    (*pIVar4->_vptr_Iterator[7])(pIVar4);
  }
  test::Tester::Tester
            ((Tester *)&last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x1de);
  iVar2 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
  test::Tester::Is((Tester *)&last,(bool)((byte)iVar2 ^ 1),"!iter->Valid()");
  test::Tester::~Tester((Tester *)&last);
  (*pIVar4->_vptr_Iterator[1])(pIVar4);
  iVar2 = (*this->constructor_->_vptr_Constructor[3])();
  test::Tester::Tester
            ((Tester *)&last,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x1e6);
  bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x10))
                    ((long *)CONCAT44(extraout_var_01,iVar2));
  test::Tester::Is((Tester *)&last,(bool)(bVar1 ^ 1),"!iter->Valid()");
  test::Tester::~Tester((Tester *)&last);
  local_230._M_dataplus._M_p = (pointer)data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar3 = Random::Next(local_210);
  (*(code *)(&DAT_0012511c + *(int *)(&DAT_0012511c + ((ulong)uVar3 % 5) * 4)))();
  return;
}

Assistant:

void Test(Random* rnd) {
    std::vector<std::string> keys;
    KVMap data;
    constructor_->Finish(options_, &keys, &data);

    TestForwardScan(keys, data);
    TestBackwardScan(keys, data);
    TestRandomAccess(rnd, keys, data);
  }